

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::verify_active_csoaa
               (label *losses,v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *known,size_t t,
               float multiplier)

{
  wclass *pwVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  ostream *poVar4;
  long lVar5;
  float fVar6;
  
  pwVar2 = (losses->costs)._begin;
  pwVar3 = (losses->costs)._end;
  for (lVar5 = 0; pwVar1 = (wclass *)((long)&pwVar2->x + lVar5), pwVar1 != pwVar3;
      lVar5 = lVar5 + 0x10) {
    if (((&known->_begin->second)[lVar5] == false) &&
       (fVar6 = *(float *)(*(long *)((long)&known->_begin->first + lVar5) + 8) - pwVar1->x,
       fVar6 = fVar6 * fVar6, multiplier / SQRT((float)t) < fVar6)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"verify_active_csoaa failed: truth ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)((long)&pwVar2->x + lVar5));
      poVar4 = std::operator<<(poVar4,", known[");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"]=");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,*(float *)(*(long *)((long)&known->_begin->first + lVar5) + 8));
      poVar4 = std::operator<<(poVar4,", error=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar6);
      poVar4 = std::operator<<(poVar4," vs threshold ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,multiplier / SQRT((float)t));
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  return;
}

Assistant:

void verify_active_csoaa(
    COST_SENSITIVE::label& losses, v_array<pair<CS::wclass&, bool>>& known, size_t t, float multiplier)
{
  float threshold = multiplier / sqrt((float)t);
  cdbg << "verify_active_csoaa, losses = [";
  for (COST_SENSITIVE::wclass& wc : losses.costs) cdbg << " " << wc.class_index << ":" << wc.x;
  cdbg << " ]" << endl;
  // cdbg_print_array("verify_active_csoaa,  known", known);
  size_t i = 0;
  for (COST_SENSITIVE::wclass& wc : losses.costs)
  {
    if (!known[i].second)
    {
      float err = pow(known[i].first.partial_prediction - wc.x, 2);
      if (err > threshold)
      {
        std::cerr << "verify_active_csoaa failed: truth " << wc.class_index << ":" << wc.x << ", known[" << i
                  << "]=" << known[i].first.partial_prediction << ", error=" << err << " vs threshold " << threshold
                  << endl;
      }
    }
    i++;
  }
}